

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

void __thiscall
cfd::TransactionContext::SplitTxOut
          (TransactionContext *this,uint32_t index,
          vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *amount_list,
          vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *locking_script_list)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  size_type sVar4;
  size_type sVar5;
  undefined8 uVar6;
  CfdException *pCVar7;
  Script *pSVar8;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *in_RCX;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 extraout_DL_03;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *in_RDX;
  uint in_ESI;
  Amount *in_RDI;
  CfdException *except;
  size_t txout_idx;
  ByteData prev_tx;
  Amount update_amount;
  Amount *amount;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *__range1;
  Amount total_amount;
  TxOutReference ref;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *in_stack_fffffffffffffd18;
  __normal_iterator<const_cfd::core::Amount_*,_std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>_>
  *in_stack_fffffffffffffd20;
  string *in_stack_fffffffffffffd30;
  allocator *message;
  CfdError in_stack_fffffffffffffd3c;
  CfdException *in_stack_fffffffffffffd40;
  CfdException *this_00;
  allocator local_1f9;
  string local_1f8 [32];
  CfdException *local_1d8;
  undefined1 local_1d0 [24];
  undefined8 local_1b8;
  undefined1 local_1b0;
  undefined8 local_1a8;
  undefined1 local_1a0;
  undefined8 local_198;
  undefined1 local_190;
  undefined8 local_188;
  undefined1 local_180;
  undefined8 local_178;
  undefined1 local_170;
  undefined8 local_168;
  undefined1 local_160;
  undefined1 local_152;
  allocator local_151;
  string local_150 [32];
  undefined8 local_130;
  undefined1 local_128;
  undefined8 local_120;
  undefined1 local_118;
  undefined8 local_110;
  undefined1 local_108;
  reference local_100;
  Amount *local_f8;
  __normal_iterator<const_cfd::core::Amount_*,_std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>_>
  local_f0;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  AbstractTxOutReference local_d0;
  undefined1 local_7a;
  allocator local_79;
  string local_78 [38];
  undefined1 local_52;
  allocator local_51;
  string local_50 [48];
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *local_20;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *local_18;
  uint local_c;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  if (SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&)
      ::kMinimumAmount == '\0') {
    iVar3 = __cxa_guard_acquire(&SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&)
                                 ::kMinimumAmount);
    if (iVar3 != 0) {
      cfd::core::Amount::Amount
                ((Amount *)
                 &SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&)
                  ::kMinimumAmount,100);
      __cxa_guard_release(&SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&)
                           ::kMinimumAmount);
    }
  }
  sVar4 = std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::size(local_18);
  sVar5 = std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::size(local_20);
  if (sVar4 != sVar5) {
    local_52 = 1;
    uVar6 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"Unmatch list count.",&local_51);
    core::CfdException::CfdException
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,in_stack_fffffffffffffd30);
    local_52 = 0;
    __cxa_throw(uVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  bVar1 = std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::empty
                    ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                     in_stack_fffffffffffffd30);
  if (bVar1) {
    local_7a = 1;
    uVar6 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"list is empty.",&local_79);
    core::CfdException::CfdException
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,in_stack_fffffffffffffd30);
    local_7a = 0;
    __cxa_throw(uVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  cfd::core::Transaction::GetTxOut((uint)&local_d0);
  local_e0 = SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&)
             ::kMinimumAmount;
  local_d8 = DAT_0059aae0;
  local_e8 = local_18;
  local_f0._M_current =
       (Amount *)
       std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::begin
                 (in_stack_fffffffffffffd18);
  local_f8 = (Amount *)
             std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::end
                       (in_stack_fffffffffffffd18);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffd20,
                       (__normal_iterator<const_cfd::core::Amount_*,_std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>_>
                        *)in_stack_fffffffffffffd18);
    if (!bVar1) break;
    local_100 = __gnu_cxx::
                __normal_iterator<const_cfd::core::Amount_*,_std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>_>
                ::operator*(&local_f0);
    local_110 = cfd::core::Amount::operator+=((Amount *)&local_e0,local_100);
    local_108 = extraout_DL;
    __gnu_cxx::
    __normal_iterator<const_cfd::core::Amount_*,_std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>_>
    ::operator++(&local_f0);
  }
  local_130 = core::AbstractTxOutReference::GetValue(&local_d0);
  local_128 = extraout_DL_00;
  local_120 = local_130;
  local_118 = extraout_DL_00;
  bVar2 = cfd::core::operator<((Amount *)&local_120,(Amount *)&local_e0);
  if ((bVar2 & 1) == 0) {
    local_188 = core::AbstractTxOutReference::GetValue(&local_d0);
    local_180 = extraout_DL_01;
    local_178 = local_188;
    local_170 = extraout_DL_01;
    local_1a8 = cfd::core::operator-
                          ((Amount *)&local_e0,
                           (Amount *)
                           &SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&)
                            ::kMinimumAmount);
    local_1a0 = extraout_DL_02;
    local_198 = local_1a8;
    local_190 = extraout_DL_02;
    local_1b8 = cfd::core::operator-((Amount *)&local_178,(Amount *)&local_198);
    local_1b0 = extraout_DL_03;
    local_168 = local_1b8;
    local_160 = extraout_DL_03;
    (**(code **)(*(long *)in_RDI + 0x40))(local_1d0);
    cfd::core::Transaction::SetTxOutValue((uint)in_RDI,(Amount *)(ulong)local_c);
    local_1d8 = (CfdException *)0x0;
    while( true ) {
      this_00 = local_1d8;
      pCVar7 = (CfdException *)
               std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::size(local_18);
      if (pCVar7 <= this_00) {
        core::ByteData::~ByteData((ByteData *)0x3af445);
        core::TxOutReference::~TxOutReference((TxOutReference *)0x3af452);
        return;
      }
      std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::operator[]
                (local_20,(size_type)local_1d8);
      bVar2 = cfd::core::Script::IsEmpty();
      in_stack_fffffffffffffd3c = CONCAT13(bVar2,(int3)in_stack_fffffffffffffd3c);
      if ((bVar2 & 1) != 0) break;
      pSVar8 = (Script *)
               std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::operator[]
                         (local_18,(size_type)local_1d8);
      std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::operator[]
                (local_20,(size_type)local_1d8);
      cfd::core::Transaction::AddTxOut(in_RDI,pSVar8);
      local_1d8 = (CfdException *)&local_1d8->field_0x1;
    }
    uVar6 = __cxa_allocate_exception(0x30);
    message = &local_1f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f8,"Locking script is empty.",message);
    core::CfdException::CfdException(this_00,in_stack_fffffffffffffd3c,(string *)message);
    __cxa_throw(uVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_152 = 1;
  uVar6 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"The Amount is too large.",&local_151);
  core::CfdException::CfdException
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,in_stack_fffffffffffffd30);
  local_152 = 0;
  __cxa_throw(uVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

void TransactionContext::SplitTxOut(
    uint32_t index, const std::vector<Amount>& amount_list,
    const std::vector<Script>& locking_script_list) {
  static const Amount kMinimumAmount(int64_t{100});

  if (amount_list.size() != locking_script_list.size()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unmatch list count.");
  } else if (amount_list.empty()) {
    throw CfdException(CfdError::kCfdIllegalArgumentError, "list is empty.");
  }

  auto ref = GetTxOut(index);
  Amount total_amount = kMinimumAmount;
  for (const auto& amount : amount_list) total_amount += amount;

  if (ref.GetValue() < total_amount) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "The Amount is too large.");
  }
  Amount update_amount = ref.GetValue() - (total_amount - kMinimumAmount);

  ByteData prev_tx = GetData();
  try {
    SetTxOutValue(index, update_amount);
    for (size_t txout_idx = 0; txout_idx < amount_list.size(); ++txout_idx) {
      if (locking_script_list[txout_idx].IsEmpty()) {
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Locking script is empty.");
      }
      AddTxOut(amount_list[txout_idx], locking_script_list[txout_idx]);
    }
  } catch (const CfdException& except) {
    SetFromHex(prev_tx.GetHex());  // rollback
    throw except;
  }
}